

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O3

void test_gzio(char *fname,Byte *uncompr,uLong uncomprLen)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  uint extraout_EAX_04;
  uint extraout_EAX_05;
  int iVar4;
  int extraout_EAX_06;
  size_t sVar5;
  char **ppcVar6;
  int *piVar7;
  long lVar8;
  size_t sVar9;
  undefined8 uVar10;
  Byte *compr;
  Byte *uncompr_00;
  ulong uVar11;
  ulong uVar12;
  ulong *__s1;
  ulong *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  char *__s1_00;
  undefined8 unaff_RBP;
  undefined4 uVar13;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  int *piVar19;
  ulong *puVar20;
  ulong *puVar21;
  uint uVar22;
  char **unaff_R13;
  ulong **ppuVar23;
  int err;
  uLong auStack_510 [2];
  undefined1 *puStack_500;
  char *pcStack_4f8;
  code *pcStack_4f0;
  ulong uStack_4e8;
  undefined4 uStack_4e0;
  undefined4 uStack_4c8;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  uLong uStack_488;
  char *pcStack_478;
  undefined1 *puStack_470;
  code *pcStack_468;
  char *pcStack_460;
  int iStack_458;
  undefined1 *puStack_448;
  undefined4 uStack_440;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  uLong uStack_400;
  ulong uStack_3e8;
  code *pcStack_3e0;
  ulong uStack_3d0;
  uint uStack_3c8;
  undefined4 uStack_3b0;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_380;
  char *pcStack_360;
  char *pcStack_358;
  ulong uStack_350;
  code *pcStack_348;
  char *pcStack_338;
  uint uStack_330;
  ulong uStack_320;
  undefined4 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  long lStack_2c8;
  ulong *puStack_2c0;
  ulong uStack_2b8;
  code *pcStack_2b0;
  ulong uStack_2a0;
  undefined4 uStack_298;
  undefined4 uStack_280;
  ulong uStack_278;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  ulong uStack_230;
  ulong *puStack_228;
  code *pcStack_218;
  ulong *puStack_210;
  uint uStack_208;
  ulong *puStack_1f8;
  uint uStack_1f0;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  char *pcStack_198;
  char **ppcStack_190;
  ulong uStack_188;
  code *pcStack_180;
  ulong uStack_178;
  undefined4 uStack_170;
  ulong uStack_168;
  undefined4 uStack_158;
  ulong uStack_150;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  char *pcStack_108;
  char *pcStack_100;
  size_t sStack_f8;
  int *piStack_f0;
  code *pcStack_e8;
  char *pcStack_d8;
  undefined4 uStack_d0;
  size_t sStack_c8;
  int *piStack_c0;
  undefined4 uStack_b8;
  char *pcStack_b0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  Byte *pBStack_68;
  size_t sStack_60;
  char **ppcStack_58;
  uLong uStack_50;
  int *piStack_48;
  char local_2c [4];
  
  sVar5 = strlen(hello);
  ppcVar6 = (char **)gzopen(fname,"wb");
  piVar7 = (int *)fname;
  if (ppcVar6 == (char **)0x0) {
LAB_00102e35:
    ppcVar6 = unaff_R13;
    test_gzio_cold_11();
LAB_00102e3a:
    test_gzio_cold_1();
LAB_00102e47:
    test_gzio_cold_2();
    fname = (char *)piVar7;
LAB_00102e54:
    piVar7 = (int *)fname;
    test_gzio_cold_10();
LAB_00102e59:
    test_gzio_cold_3();
LAB_00102e66:
    test_gzio_cold_4();
LAB_00102e6e:
    test_gzio_cold_6();
LAB_00102e73:
    test_gzio_cold_7();
LAB_00102e78:
    pcVar14 = local_2c;
    piVar19 = piVar7;
    test_gzio_cold_8();
  }
  else {
    gzputc(ppcVar6,0x68);
    iVar2 = gzputs(ppcVar6,"ello");
    if (iVar2 != 4) goto LAB_00102e3a;
    iVar2 = gzprintf(ppcVar6,", %s!","hello");
    if (iVar2 != 8) goto LAB_00102e47;
    gzseek(ppcVar6,1,1);
    gzclose(ppcVar6);
    piVar7 = (int *)gzopen(fname,"rb");
    if (piVar7 == (int *)0x0) goto LAB_00102e54;
    uVar22 = (int)sVar5 + 1;
    sVar5 = (size_t)uVar22;
    builtin_memcpy(uncompr,"garbage",8);
    uVar3 = gzread(piVar7,uncompr,uncomprLen & 0xffffffff);
    if (uVar3 != uVar22) goto LAB_00102e59;
    iVar2 = strcmp((char *)uncompr,hello);
    if (iVar2 != 0) goto LAB_00102e66;
    printf("gzread(): %s\n",uncompr);
    sVar5 = gzseek(piVar7,0xfffffffffffffff8,1);
    if ((sVar5 != 6) || (lVar8 = gztell(piVar7), lVar8 != 6)) {
      test_gzio_cold_5();
      unaff_R13 = ppcVar6;
      goto LAB_00102e35;
    }
    if (*piVar7 == 0) {
      uVar3 = gzgetc(piVar7);
    }
    else {
      *piVar7 = *piVar7 + -1;
      *(long *)(piVar7 + 4) = *(long *)(piVar7 + 4) + 1;
      pbVar1 = *(byte **)(piVar7 + 2);
      *(byte **)(piVar7 + 2) = pbVar1 + 1;
      uVar3 = (uint)*pbVar1;
    }
    if (uVar3 != 0x20) goto LAB_00102e6e;
    iVar2 = gzungetc(0x20,piVar7);
    if (iVar2 != 0x20) goto LAB_00102e73;
    gzgets(piVar7,uncompr,uncomprLen & 0xffffffff);
    sVar9 = strlen((char *)uncompr);
    if (sVar9 != 7) goto LAB_00102e78;
    pcVar14 = hello + 6;
    piVar19 = (int *)uncompr;
    iVar2 = strcmp((char *)uncompr,hello + 6);
    if (iVar2 == 0) {
      printf("gzgets() after gzseek: %s\n",uncompr);
      gzclose(piVar7);
      return;
    }
  }
  test_gzio_cold_9();
  pcStack_e8 = (code *)0x102ead;
  pBStack_68 = uncompr;
  sStack_60 = sVar5;
  ppcStack_58 = ppcVar6;
  uStack_50 = uncomprLen;
  piStack_48 = piVar7;
  sVar5 = strlen(hello);
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uVar15 = 0xffffffff;
  uVar11 = 0x70;
  pcStack_e8 = (code *)0x102eda;
  iVar2 = deflateInit_(&pcStack_d8,0xffffffff,"1.2.8");
  if (iVar2 == 0) {
    sVar5 = sVar5 + 1;
    ppcVar6 = &pcStack_d8;
    pcStack_d8 = hello;
    unaff_RBP = 1;
    piStack_c0 = piVar19;
    do {
      if ((sStack_c8 == sVar5) || (pcVar14 <= pcStack_b0)) goto LAB_00102f22;
      uStack_b8 = 1;
      uStack_d0 = 1;
      pcStack_e8 = (code *)0x102f17;
      iVar2 = deflate(ppcVar6,0);
    } while (iVar2 == 0);
    pcStack_e8 = (code *)0x102f22;
    test_deflate_cold_4();
LAB_00102f22:
    do {
      uStack_b8 = 1;
      uVar15 = 4;
      pcStack_e8 = (code *)0x102f38;
      iVar2 = deflate();
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      pcStack_e8 = (code *)0x102f65;
      test_deflate_cold_3();
      goto LAB_00102f65;
    }
    pcStack_e8 = (code *)0x102f4b;
    uVar3 = deflateEnd(&pcStack_d8);
    if (uVar3 == 0) {
      return;
    }
  }
  else {
LAB_00102f65:
    pcStack_e8 = (code *)0x102f6c;
    test_deflate_cold_1();
    uVar3 = extraout_EAX;
  }
  uVar17 = (ulong)uVar3;
  pcStack_e8 = test_inflate;
  test_deflate_cold_2();
  pcStack_100 = hello;
  *__s1 = 0x65676162726167;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_170 = 0;
  pcVar16 = "1.2.8";
  pcStack_180 = (code *)0x102fc9;
  uVar12 = uVar11;
  uStack_178 = uVar17;
  pcStack_108 = pcVar14;
  sStack_f8 = sVar5;
  piStack_f0 = piVar19;
  pcStack_e8 = (code *)unaff_RBP;
  iVar2 = inflateInit_(&uStack_178,"1.2.8",0x70);
  puVar21 = (ulong *)hello;
  if (iVar2 == 0) {
    unaff_RBP = 1;
    do {
      if ((uVar11 <= uStack_150) || (uVar15 <= uStack_168)) goto LAB_00102ffe;
      uStack_158 = 1;
      uStack_170 = 1;
      pcVar16 = (char *)0x0;
      pcStack_180 = (code *)0x102ff5;
      iVar2 = inflate(&uStack_178);
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      pcStack_180 = (code *)0x103042;
      test_inflate_cold_4();
      puVar21 = &uStack_178;
      goto LAB_00103042;
    }
LAB_00102ffe:
    pcStack_180 = (code *)0x103006;
    uVar3 = inflateEnd(&uStack_178);
    puVar21 = &uStack_178;
    if (uVar3 != 0) goto LAB_00103049;
    pcVar16 = hello;
    pcStack_180 = (code *)0x103019;
    puVar20 = __s1;
    iVar2 = strcmp((char *)__s1,hello);
    puVar21 = &uStack_178;
    if (iVar2 == 0) {
      pcStack_180 = (code *)0x10302e;
      printf("inflate(): %s\n",__s1);
      return;
    }
  }
  else {
LAB_00103042:
    pcStack_180 = (code *)0x103049;
    test_inflate_cold_1();
    uVar3 = extraout_EAX_00;
LAB_00103049:
    puVar20 = (ulong *)(ulong)uVar3;
    pcStack_180 = (code *)0x103050;
    test_inflate_cold_2();
  }
  pcStack_180 = test_large_deflate;
  test_inflate_cold_3();
  ppuVar23 = &puStack_210;
  uStack_1d0 = 0;
  uStack_1c8 = 0;
  uStack_1c0 = 0;
  uVar17 = 1;
  lVar8 = 0x70;
  pcStack_218 = (code *)0x103096;
  pcStack_198 = (char *)puVar21;
  ppcStack_190 = ppcVar6;
  uStack_188 = uVar11;
  pcStack_180 = (code *)uVar15;
  iVar2 = deflateInit_(&puStack_210,1,"1.2.8");
  if (iVar2 == 0) {
    uVar17 = 0;
    pcStack_218 = (code *)0x1030b6;
    puStack_210 = extraout_RDX;
    uStack_208 = (uint)uVar12;
    puStack_1f8 = puVar20;
    uStack_1f0 = (uint)pcVar16;
    iVar2 = deflate();
    if (iVar2 != 0) goto LAB_0010314e;
    if (uStack_208 != 0) goto LAB_00103155;
    pcStack_218 = (code *)0x1030d8;
    deflateParams(&puStack_210,0,0);
    uStack_208 = (uint)pcVar16 >> 1;
    pcVar16 = (char *)(ulong)uStack_208;
    uVar17 = 0;
    pcStack_218 = (code *)0x1030ed;
    puStack_210 = puVar20;
    iVar2 = deflate(&puStack_210);
    if (iVar2 != 0) goto LAB_0010315a;
    pcStack_218 = (code *)0x103106;
    deflateParams(&puStack_210,9,1);
    uVar17 = 0;
    pcStack_218 = (code *)0x103117;
    puStack_210 = extraout_RDX;
    uStack_208 = (uint)uVar12;
    iVar2 = deflate(&puStack_210);
    if (iVar2 != 0) goto LAB_00103161;
    uVar17 = 4;
    pcStack_218 = (code *)0x103128;
    iVar2 = deflate(&puStack_210);
    ppuVar23 = &puStack_210;
    if (iVar2 != 1) goto LAB_00103168;
    pcStack_218 = (code *)0x103135;
    uVar3 = deflateEnd(&puStack_210);
    ppuVar23 = &puStack_210;
    if (uVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_218 = (code *)0x10314e;
    test_large_deflate_cold_1();
LAB_0010314e:
    pcStack_218 = (code *)0x103155;
    test_large_deflate_cold_2();
LAB_00103155:
    pcStack_218 = (code *)0x10315a;
    test_large_deflate_cold_3();
LAB_0010315a:
    ppuVar23 = (ulong **)pcVar16;
    pcStack_218 = (code *)0x103161;
    test_large_deflate_cold_4();
LAB_00103161:
    pcStack_218 = (code *)0x103168;
    test_large_deflate_cold_5();
LAB_00103168:
    pcStack_218 = (code *)0x10316d;
    test_large_deflate_cold_6();
    uVar3 = extraout_EAX_01;
  }
  uVar11 = (ulong)uVar3;
  pcStack_218 = test_large_inflate;
  test_large_deflate_cold_7();
  *extraout_RDX_00 = 0x65676162726167;
  uStack_260 = 0;
  uStack_258 = 0;
  uStack_250 = 0;
  uStack_298 = (undefined4)uVar17;
  pcVar14 = "1.2.8";
  pcStack_2b0 = (code *)0x1031c4;
  uStack_2a0 = uVar11;
  uStack_230 = uVar12;
  puStack_228 = puVar20;
  pcStack_218 = (code *)ppuVar23;
  iVar2 = inflateInit_(&uStack_2a0,"1.2.8",0x70);
  if (iVar2 == 0) {
    puVar20 = &uStack_2a0;
    do {
      uStack_280 = (undefined4)lVar8;
      pcVar14 = (char *)0x0;
      pcStack_2b0 = (code *)0x1031e0;
      iVar2 = inflate(puVar20);
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      pcStack_2b0 = (code *)0x103227;
      test_large_inflate_cold_4();
      goto LAB_00103227;
    }
    pcStack_2b0 = (code *)0x1031f3;
    uVar3 = inflateEnd(&uStack_2a0);
    if (uVar3 != 0) goto LAB_0010322e;
    uVar17 = uVar17 >> 1;
    uVar11 = uStack_278;
    if (uStack_278 == uVar17 + lVar8 * 2) {
      pcStack_2b0 = (code *)0x103214;
      puts("large_inflate(): OK");
      return;
    }
  }
  else {
LAB_00103227:
    pcStack_2b0 = (code *)0x10322e;
    test_large_inflate_cold_1();
    uVar3 = extraout_EAX_02;
LAB_0010322e:
    uVar11 = (ulong)uVar3;
    pcStack_2b0 = (code *)0x103235;
    test_large_inflate_cold_2();
  }
  pcStack_2b0 = test_flush;
  test_large_inflate_cold_3();
  pcStack_348 = (code *)0x10325a;
  lStack_2c8 = lVar8;
  puStack_2c0 = puVar20;
  uStack_2b8 = uVar17;
  sVar5 = strlen(hello);
  uStack_2f8 = 0;
  uStack_2f0 = 0;
  uStack_2e8 = 0;
  uVar15 = 0xffffffff;
  ppcVar6 = (char **)0x70;
  pcStack_348 = (code *)0x103287;
  iVar2 = deflateInit_(&pcStack_338,0xffffffff,"1.2.8");
  if (iVar2 == 0) {
    pcStack_338 = hello;
    uStack_330 = 3;
    uStack_318 = *(undefined4 *)pcVar14;
    uVar15 = 3;
    pcStack_348 = (code *)0x1032ad;
    uStack_320 = uVar11;
    iVar2 = deflate();
    if (iVar2 != 0) goto LAB_001032fa;
    *(char *)(uVar11 + 3) = *(char *)(uVar11 + 3) + '\x01';
    uStack_330 = (int)sVar5 - 2;
    sVar5 = (size_t)uStack_330;
    uVar15 = 4;
    pcStack_348 = (code *)0x1032cc;
    uVar3 = deflate();
    if (1 < uVar3) goto LAB_00103301;
    pcStack_348 = (code *)0x1032db;
    uVar3 = deflateEnd(&pcStack_338);
    if (uVar3 == 0) {
      *(undefined8 *)pcVar14 = uStack_310;
      return;
    }
  }
  else {
    pcStack_348 = (code *)0x1032fa;
    test_flush_cold_1();
LAB_001032fa:
    pcStack_348 = (code *)0x103301;
    test_flush_cold_2();
LAB_00103301:
    pcStack_348 = (code *)0x103308;
    test_flush_cold_4();
    uVar3 = extraout_EAX_03;
  }
  uVar12 = (ulong)uVar3;
  pcStack_348 = test_sync;
  test_flush_cold_3();
  pcStack_358 = hello;
  *extraout_RDX_01 = 0x65676162726167;
  uStack_390 = 0;
  uStack_388 = 0;
  uStack_380 = 0;
  uStack_3c8 = 2;
  pcVar16 = "1.2.8";
  pcStack_3e0 = (code *)0x103362;
  uStack_3d0 = uVar12;
  pcStack_360 = pcVar14;
  uStack_350 = uVar11;
  pcStack_348 = (code *)sVar5;
  iVar2 = inflateInit_(&uStack_3d0,"1.2.8",0x70);
  if (iVar2 == 0) {
    uStack_3b0 = SUB84(ppcVar6,0);
    pcVar16 = (char *)0x0;
    pcStack_3e0 = (code *)0x10337f;
    inflate(&uStack_3d0);
    uStack_3c8 = (int)uVar15 - 2;
    uVar15 = (ulong)uStack_3c8;
    pcStack_3e0 = (code *)0x103390;
    iVar2 = inflateSync(&uStack_3d0);
    if (iVar2 != 0) goto LAB_001033da;
    pcVar16 = (char *)0x4;
    pcStack_3e0 = (code *)0x1033a3;
    iVar2 = inflate(&uStack_3d0);
    if (iVar2 != -3) goto LAB_001033e1;
    pcStack_3e0 = (code *)0x1033b2;
    uVar3 = inflateEnd(&uStack_3d0);
    if (uVar3 == 0) {
      pcStack_3e0 = (code *)0x1033c7;
      printf("after inflateSync(): hel%s\n",extraout_RDX_01);
      return;
    }
  }
  else {
    pcStack_3e0 = (code *)0x1033da;
    test_sync_cold_1();
LAB_001033da:
    pcStack_3e0 = (code *)0x1033e1;
    test_sync_cold_2();
LAB_001033e1:
    pcStack_3e0 = (code *)0x1033e6;
    test_sync_cold_3();
    uVar3 = extraout_EAX_04;
  }
  puVar21 = (ulong *)(ulong)uVar3;
  pcStack_3e0 = test_dict_deflate;
  test_sync_cold_4();
  uStack_420 = 0;
  uStack_418 = 0;
  uStack_410 = 0;
  uVar13 = 9;
  pcVar14 = (char *)0x70;
  pcStack_468 = (code *)0x103424;
  uStack_3e8 = uVar15;
  pcStack_3e0 = (code *)ppcVar6;
  iVar2 = deflateInit_(&pcStack_460,9,"1.2.8");
  if (iVar2 == 0) {
    uVar13 = 0x104004;
    pcStack_468 = (code *)0x10343c;
    iVar2 = deflateSetDictionary(&pcStack_460,"hello",6);
    if (iVar2 != 0) goto LAB_0010349a;
    dictId = uStack_400;
    uStack_440 = SUB84(pcVar16,0);
    pcStack_460 = hello;
    pcStack_468 = (code *)0x103465;
    puStack_448 = (undefined1 *)puVar21;
    sVar5 = strlen(hello);
    iStack_458 = (int)sVar5 + 1;
    uVar13 = 4;
    pcStack_468 = (code *)0x103478;
    iVar2 = deflate(&pcStack_460);
    ppcVar6 = &pcStack_460;
    if (iVar2 != 1) goto LAB_001034a1;
    pcStack_468 = (code *)0x103485;
    uVar3 = deflateEnd(&pcStack_460);
    ppcVar6 = &pcStack_460;
    if (uVar3 == 0) {
      return;
    }
  }
  else {
    pcStack_468 = (code *)0x10349a;
    test_dict_deflate_cold_1();
LAB_0010349a:
    pcStack_468 = (code *)0x1034a1;
    test_dict_deflate_cold_2();
LAB_001034a1:
    pcStack_468 = (code *)0x1034a6;
    test_dict_deflate_cold_3();
    uVar3 = extraout_EAX_05;
  }
  uVar11 = (ulong)uVar3;
  pcStack_468 = test_dict_inflate;
  test_dict_deflate_cold_4();
  builtin_strncpy(__s1_00,"garbage",8);
  uStack_4a8 = 0;
  uStack_4a0 = 0;
  uStack_498 = 0;
  pcVar18 = "1.2.8";
  pcStack_4f0 = (code *)0x1034f5;
  uStack_4e8 = uVar11;
  uStack_4e0 = uVar13;
  pcStack_478 = pcVar16;
  puStack_470 = (undefined1 *)puVar21;
  pcStack_468 = (code *)ppcVar6;
  iVar2 = inflateInit_(&uStack_4e8,"1.2.8",0x70);
  if (iVar2 == 0) {
    uStack_4c8 = SUB84(pcVar14,0);
    pcVar14 = "hello";
    do {
      pcVar18 = (char *)0x0;
      pcStack_4f0 = (code *)0x103519;
      iVar2 = inflate(&uStack_4e8);
      if (iVar2 == 2) {
        if (uStack_488 != dictId) {
          pcStack_4f0 = (code *)0x10358d;
          test_dict_inflate_cold_2();
          puVar21 = &uStack_4e8;
          goto LAB_0010358d;
        }
        pcVar18 = "hello";
        pcStack_4f0 = (code *)0x103543;
        iVar2 = inflateSetDictionary(&uStack_4e8,"hello",6);
      }
      else if (iVar2 == 1) goto LAB_0010354e;
    } while (iVar2 == 0);
    pcStack_4f0 = (code *)0x10354e;
    test_dict_inflate_cold_5();
LAB_0010354e:
    pcStack_4f0 = (code *)0x103556;
    iVar2 = inflateEnd(&uStack_4e8);
    puVar21 = &uStack_4e8;
    if (iVar2 == 0) {
      pcVar18 = hello;
      pcStack_4f0 = (code *)0x103569;
      pcVar16 = __s1_00;
      iVar4 = strcmp(__s1_00,hello);
      iVar2 = (int)pcVar16;
      puVar21 = &uStack_4e8;
      if (iVar4 == 0) {
        pcStack_4f0 = (code *)0x10357e;
        printf("inflate with dictionary: %s\n",__s1_00);
        return;
      }
      goto LAB_0010359b;
    }
  }
  else {
LAB_0010358d:
    pcStack_4f0 = (code *)0x103594;
    test_dict_inflate_cold_1();
    iVar2 = extraout_EAX_06;
  }
  pcStack_4f0 = (code *)0x10359b;
  test_dict_inflate_cold_3();
LAB_0010359b:
  pcStack_4f0 = main;
  test_dict_inflate_cold_4();
  auStack_510[0] = 40000;
  puStack_500 = (undefined1 *)puVar21;
  pcStack_4f8 = pcVar14;
  pcStack_4f0 = (code *)unaff_RBP;
  pcVar14 = (char *)zlibVersion();
  if (*pcVar14 == '1') {
    pcVar14 = (char *)zlibVersion();
    iVar4 = strcmp(pcVar14,"1.2.8");
    if (iVar4 != 0) {
      main_cold_2();
    }
    uVar10 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar10);
    compr = (Byte *)calloc(40000,1);
    uncompr_00 = (Byte *)calloc(40000,1);
    if ((compr != (Byte *)0x0) && (uncompr_00 != (Byte *)0x0)) {
      test_compress(compr,40000,uncompr_00,40000);
      if (iVar2 < 2) {
        pcVar14 = "foo.gz";
      }
      else {
        pcVar14 = *(char **)(pcVar18 + 8);
      }
      test_gzio(pcVar14,uncompr_00,40000);
      test_deflate(compr,40000);
      test_inflate(compr,40000,uncompr_00,40000);
      test_large_deflate(compr,40000,uncompr_00,40000);
      test_large_inflate(compr,40000,uncompr_00,40000);
      test_flush(compr,auStack_510);
      test_sync(compr,auStack_510[0],uncompr_00,40000);
      test_dict_deflate(compr,40000);
      test_dict_inflate(compr,40000,uncompr_00,40000);
      free(compr);
      free(uncompr_00);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_gzio(fname, uncompr, uncomprLen)
    const char *fname; /* compressed file name */
    Byte *uncompr;
    uLong uncomprLen;
{
#ifdef NO_GZCOMPRESS
    fprintf(stderr, "NO_GZCOMPRESS -- gz* functions cannot compress\n");
#else
    int err;
    int len = (int)strlen(hello)+1;
    gzFile file;
    z_off_t pos;

    file = gzopen(fname, "wb");
    if (file == NULL) {
        fprintf(stderr, "gzopen error\n");
        exit(1);
    }
    gzputc(file, 'h');
    if (gzputs(file, "ello") != 4) {
        fprintf(stderr, "gzputs err: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (gzprintf(file, ", %s!", "hello") != 8) {
        fprintf(stderr, "gzprintf err: %s\n", gzerror(file, &err));
        exit(1);
    }
    gzseek(file, 1L, SEEK_CUR); /* add one zero byte */
    gzclose(file);

    file = gzopen(fname, "rb");
    if (file == NULL) {
        fprintf(stderr, "gzopen error\n");
        exit(1);
    }
    strcpy((char*)uncompr, "garbage");

    if (gzread(file, uncompr, (unsigned)uncomprLen) != len) {
        fprintf(stderr, "gzread err: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad gzread: %s\n", (char*)uncompr);
        exit(1);
    } else {
        printf("gzread(): %s\n", (char*)uncompr);
    }

    pos = gzseek(file, -8L, SEEK_CUR);
    if (pos != 6 || gztell(file) != pos) {
        fprintf(stderr, "gzseek error, pos=%ld, gztell=%ld\n",
                (long)pos, (long)gztell(file));
        exit(1);
    }

    if (gzgetc(file) != ' ') {
        fprintf(stderr, "gzgetc error\n");
        exit(1);
    }

    if (gzungetc(' ', file) != ' ') {
        fprintf(stderr, "gzungetc error\n");
        exit(1);
    }

    gzgets(file, (char*)uncompr, (int)uncomprLen);
    if (strlen((char*)uncompr) != 7) { /* " hello!" */
        fprintf(stderr, "gzgets err after gzseek: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (strcmp((char*)uncompr, hello + 6)) {
        fprintf(stderr, "bad gzgets after gzseek\n");
        exit(1);
    } else {
        printf("gzgets() after gzseek: %s\n", (char*)uncompr);
    }

    gzclose(file);
#endif
}